

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  short sVar1;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  parasail_result_t *ppVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  int16_t iVar28;
  short sVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  undefined8 unaff_R12;
  short sVar34;
  undefined4 uVar35;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar39;
  short sVar45;
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ushort uVar48;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  short local_108;
  short sStack_106;
  uint local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  parasail_result_t *local_68;
  int *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar59;
  short sVar63;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_sse41_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_sse41_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_sse41_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_sse41_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_diag_sse41_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_diag_sse41_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_diag_sse41_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar17 = matrix->min;
    iVar21 = -iVar17;
    if (iVar17 != -open && SBORROW4(iVar17,-open) == iVar17 + open < 0) {
      iVar21 = open;
    }
    uVar23 = iVar21 - 0x7fff;
    iVar17 = matrix->max;
    auVar36 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),0);
    uVar35 = auVar36._0_4_;
    local_78._4_4_ = uVar35;
    local_78._0_4_ = uVar35;
    local_78._8_4_ = uVar35;
    local_78._12_4_ = uVar35;
    local_c8._4_4_ = uVar35;
    local_c8._0_4_ = uVar35;
    local_c8._8_4_ = uVar35;
    local_c8._12_4_ = uVar35;
    local_108 = auVar36._0_2_;
    sStack_106 = auVar36._2_2_;
    local_d8._4_4_ = uVar35;
    local_d8._0_4_ = uVar35;
    local_d8._8_4_ = uVar35;
    local_d8._12_4_ = uVar35;
    local_88 = _s1;
    local_68 = parasail_result_new();
    if (local_68 != (parasail_result_t *)0x0) {
      local_68->flag = local_68->flag | 0x8201004;
      uVar22 = (ulong)(s2Len + 0xe);
      local_a8 = open;
      local_98 = gap;
      ptr = parasail_memalign_int16_t(0x10,uVar22);
      ptr_00 = parasail_memalign_int16_t(0x10,uVar22);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar22);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
        if (matrix->type == 0) {
          iVar21 = _s1Len + 7;
          ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar21);
          if (ptr_02 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar6 = matrix->mapper;
            uVar22 = 0;
            do {
              ptr_02[uVar22] = (int16_t)piVar6[(byte)local_88[uVar22]];
              uVar22 = uVar22 + 1;
            } while ((uint)_s1Len != uVar22);
          }
          iVar16 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < iVar21) {
            iVar16 = iVar21;
          }
          memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar16) * 2 + 2);
        }
        else {
          ptr_02 = (int16_t *)0x0;
        }
        uVar30 = s2Len + 7;
        auVar36 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R12 >> 0x10),0x7ffe - (short)iVar17));
        auVar36 = pshuflw(auVar36,auVar36,0);
        local_b8 = auVar36._0_2_;
        sStack_b6 = auVar36._2_2_;
        auVar36._4_2_ = local_108;
        auVar36._0_4_ = uVar35;
        auVar36._6_2_ = sStack_106;
        auVar36._8_2_ = local_108;
        auVar36._10_2_ = sStack_106;
        auVar36._12_2_ = local_108;
        auVar36._14_2_ = sStack_106;
        local_48 = pblendw((undefined1  [16])0x0,auVar36,0x7f);
        auVar36 = pshuflw(ZEXT416(local_a8),ZEXT416(local_a8),0);
        local_88._0_4_ = auVar36._0_4_;
        auVar36 = pshuflw(ZEXT416(local_98),ZEXT416(local_98),0);
        local_98 = auVar36._0_4_;
        auVar36 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
        local_58 = auVar36._0_4_;
        auVar36 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        local_a8 = auVar36._0_4_;
        piVar6 = matrix->mapper;
        uVar19 = (ulong)(uint)s2Len;
        uVar22 = 0;
        do {
          ptr[uVar22 + 7] = (int16_t)piVar6[(byte)_s2[uVar22]];
          uVar22 = uVar22 + 1;
        } while (uVar19 != uVar22);
        uVar22 = 0;
        ptr[3] = 0;
        ptr[4] = 0;
        ptr[5] = 0;
        ptr[6] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        ptr[2] = 0;
        ptr[3] = 0;
        uVar14 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar30) {
          uVar14 = uVar30;
        }
        sStack_b4 = local_b8;
        sStack_b2 = sStack_b6;
        sStack_b0 = local_b8;
        sStack_ae = sStack_b6;
        sStack_ac = local_b8;
        sStack_aa = sStack_b6;
        uStack_a4 = local_a8;
        uStack_a0 = local_a8;
        uStack_9c = local_a8;
        uStack_94 = local_98;
        uStack_90 = local_98;
        uStack_8c = local_98;
        uStack_80 = (undefined4)local_88;
        local_88._4_4_ = (undefined4)local_88;
        uStack_7c = uStack_80;
        uStack_54 = local_58;
        uStack_50 = local_58;
        uStack_4c = local_58;
        memset(ptr + uVar19 + 7,0,(ulong)(~s2Len + uVar14) * 2 + 2);
        ppVar13 = local_68;
        do {
          ptr_00[uVar22 + 7] = 0;
          iVar28 = (int16_t)uVar23;
          ptr_01[uVar22 + 7] = iVar28;
          uVar22 = uVar22 + 1;
        } while (uVar19 != uVar22);
        lVar18 = 0;
        do {
          ptr_00[lVar18] = iVar28;
          ptr_01[lVar18] = iVar28;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 7);
        lVar18 = uVar19 + 7;
        do {
          ptr_00[lVar18] = iVar28;
          ptr_01[lVar18] = iVar28;
          lVar18 = lVar18 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar30);
        if (_s1Len < 1) {
          local_148._4_2_ = local_108;
          local_148._0_4_ = uVar35;
          local_148._6_2_ = sStack_106;
          local_148._8_2_ = local_108;
          local_148._10_2_ = sStack_106;
          local_148._12_2_ = local_108;
          local_148._14_2_ = sStack_106;
          local_c8 = local_148;
          local_138._0_2_ = local_b8;
          local_138._2_2_ = sStack_b6;
          local_138._4_2_ = sStack_b4;
          local_138._6_2_ = sStack_b2;
          uStack_130._0_2_ = sStack_b0;
          uStack_130._2_2_ = sStack_ae;
          uStack_130._4_2_ = sStack_ac;
          uStack_130._6_2_ = sStack_aa;
        }
        else {
          local_60 = matrix->matrix;
          iVar17 = matrix->size;
          iVar21 = matrix->type;
          uVar14 = _s1Len - 1;
          uVar22 = 1;
          if (1 < (int)uVar30) {
            uVar22 = (ulong)uVar30;
          }
          uVar19 = (ulong)(uint)_s1Len;
          auVar36 = pmovsxbw(in_XMM8,0x1020304050607);
          uVar25 = 0;
          local_138 = CONCAT26(sStack_b2,CONCAT24(sStack_b4,CONCAT22(sStack_b6,local_b8)));
          uStack_130 = CONCAT26(sStack_aa,CONCAT24(sStack_ac,CONCAT22(sStack_ae,sStack_b0)));
          local_c8._4_2_ = local_108;
          local_c8._6_2_ = sStack_106;
          local_c8._8_2_ = local_108;
          local_c8._10_2_ = sStack_106;
          local_c8._12_2_ = local_108;
          local_c8._14_2_ = sStack_106;
          local_148 = local_c8;
          do {
            if (iVar21 == 0) {
              uVar30 = (uint)ptr_02[uVar25];
              uVar24 = (uint)ptr_02[uVar25 + 1];
              uVar15 = (uint)ptr_02[uVar25 + 2];
              uVar31 = (uint)ptr_02[uVar25 + 3];
              uVar26 = (uint)ptr_02[uVar25 + 4];
              uVar33 = (uint)ptr_02[uVar25 + 5];
              local_e0 = (uint)ptr_02[uVar25 + 6];
              uVar32 = (int)ptr_02[uVar25 + 7];
            }
            else {
              uVar30 = (uint)uVar25;
              uVar24 = uVar30 | 1;
              if (uVar19 <= (uVar25 | 1)) {
                uVar24 = uVar14;
              }
              uVar15 = uVar30 | 2;
              if (uVar19 <= (uVar25 | 2)) {
                uVar15 = uVar14;
              }
              uVar31 = uVar30 | 3;
              if (uVar19 <= (uVar25 | 3)) {
                uVar31 = uVar14;
              }
              uVar26 = uVar30 | 4;
              if (uVar19 <= (uVar25 | 4)) {
                uVar26 = uVar14;
              }
              uVar33 = uVar30 | 5;
              if (uVar19 <= (uVar25 | 5)) {
                uVar33 = uVar14;
              }
              local_e0 = uVar30 | 6;
              if (uVar19 <= (uVar25 | 6)) {
                local_e0 = uVar14;
              }
              uVar32 = uVar30 | 7;
              if (uVar19 <= (uVar25 | 7)) {
                uVar32 = uVar14;
              }
            }
            auVar69._0_2_ = -(ushort)(auVar36._0_2_ < (short)local_58);
            auVar69._2_2_ = -(ushort)(auVar36._2_2_ < local_58._2_2_);
            auVar69._4_2_ = -(ushort)(auVar36._4_2_ < (short)uStack_54);
            auVar69._6_2_ = -(ushort)(auVar36._6_2_ < uStack_54._2_2_);
            auVar69._8_2_ = -(ushort)(auVar36._8_2_ < (short)uStack_50);
            auVar69._10_2_ = -(ushort)(auVar36._10_2_ < uStack_50._2_2_);
            auVar69._12_2_ = -(ushort)(auVar36._12_2_ < (short)uStack_4c);
            auVar69._14_2_ = -(ushort)(auVar36._14_2_ < uStack_4c._2_2_);
            uVar20 = 0;
            in_XMM12 = pmovsxbw(in_XMM12,0xfffefdfcfbfaf9);
            auVar46._4_2_ = local_108;
            auVar46._0_4_ = uVar35;
            auVar46._6_2_ = sStack_106;
            auVar46._8_2_ = local_108;
            auVar46._10_2_ = sStack_106;
            auVar46._12_2_ = local_108;
            auVar46._14_2_ = sStack_106;
            auVar66 = local_48;
            auVar65 = local_48;
            auVar68 = auVar46;
            do {
              auVar37._10_2_ = (short)local_60[(long)(int)(uVar15 * iVar17) + (long)ptr[uVar20 + 5]]
              ;
              auVar37._8_2_ = (short)local_60[(long)(int)(uVar31 * iVar17) + (long)ptr[uVar20 + 4]];
              auVar37._12_2_ = (short)local_60[(long)(int)(uVar24 * iVar17) + (long)ptr[uVar20 + 6]]
              ;
              auVar37._14_2_ = (short)local_60[(long)(int)(uVar30 * iVar17) + (long)ptr[uVar20 + 7]]
              ;
              auVar37._0_8_ =
                   (ulong)(uint)local_60[(long)(int)(uVar32 * iVar17) + (long)ptr[uVar20]] &
                   0xffffffff0000ffff |
                   (ulong)*(ushort *)
                           (local_60 + (long)(int)(local_e0 * iVar17) + (long)ptr[uVar20 + 1]) <<
                   0x10 | (ulong)*(ushort *)
                                  (local_60 + (long)(int)(uVar33 * iVar17) + (long)ptr[uVar20 + 2])
                          << 0x20 |
                   (ulong)*(ushort *)
                           (local_60 + (long)(int)(uVar26 * iVar17) + (long)ptr[uVar20 + 3]) << 0x30
              ;
              auVar37 = paddsw(auVar37,auVar65);
              auVar65._0_8_ = auVar66._2_8_;
              auVar65._8_8_ = auVar66._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar20 + 7] << 0x30;
              auVar60._0_8_ = auVar46._2_8_;
              auVar60._8_8_ = auVar46._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar20 + 7] << 0x30;
              auVar71._4_4_ = local_88._4_4_;
              auVar71._0_4_ = (undefined4)local_88;
              auVar71._8_4_ = uStack_80;
              auVar71._12_4_ = uStack_7c;
              auVar46 = psubsw(auVar65,auVar71);
              auVar70._4_4_ = uStack_94;
              auVar70._0_4_ = local_98;
              auVar70._8_4_ = uStack_90;
              auVar70._12_4_ = uStack_8c;
              auVar61 = psubsw(auVar60,auVar70);
              sVar29 = auVar46._0_2_;
              sVar59 = auVar61._0_2_;
              auVar62._0_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._2_2_;
              sVar59 = auVar61._2_2_;
              auVar62._2_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._4_2_;
              sVar59 = auVar61._4_2_;
              auVar62._4_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._6_2_;
              sVar59 = auVar61._6_2_;
              auVar62._6_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._8_2_;
              sVar59 = auVar61._8_2_;
              auVar62._8_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._10_2_;
              sVar59 = auVar61._10_2_;
              auVar62._10_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._12_2_;
              sVar59 = auVar61._12_2_;
              sVar63 = auVar61._14_2_;
              auVar62._12_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._14_2_;
              auVar62._14_2_ =
                   (ushort)(sVar63 < sVar29) * sVar29 | (ushort)(sVar63 >= sVar29) * sVar63;
              auVar46 = psubsw(auVar66,auVar71);
              auVar66 = psubsw(auVar68,auVar70);
              sVar29 = auVar46._0_2_;
              sVar59 = auVar66._0_2_;
              auVar67._0_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._2_2_;
              sVar59 = auVar66._2_2_;
              auVar67._2_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._4_2_;
              sVar59 = auVar66._4_2_;
              auVar67._4_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._6_2_;
              sVar59 = auVar66._6_2_;
              auVar67._6_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._8_2_;
              sVar59 = auVar66._8_2_;
              auVar67._8_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._10_2_;
              sVar59 = auVar66._10_2_;
              auVar67._10_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._12_2_;
              sVar59 = auVar66._12_2_;
              sVar63 = auVar66._14_2_;
              auVar67._12_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar29 = auVar46._14_2_;
              auVar67._14_2_ =
                   (ushort)(sVar63 < sVar29) * sVar29 | (ushort)(sVar63 >= sVar29) * sVar63;
              uVar48 = ((short)auVar67._0_2_ < (short)auVar62._0_2_) * auVar62._0_2_ |
                       ((short)auVar67._0_2_ >= (short)auVar62._0_2_) * auVar67._0_2_;
              uVar51 = ((short)auVar67._2_2_ < (short)auVar62._2_2_) * auVar62._2_2_ |
                       ((short)auVar67._2_2_ >= (short)auVar62._2_2_) * auVar67._2_2_;
              uVar52 = ((short)auVar67._4_2_ < (short)auVar62._4_2_) * auVar62._4_2_ |
                       ((short)auVar67._4_2_ >= (short)auVar62._4_2_) * auVar67._4_2_;
              uVar53 = ((short)auVar67._6_2_ < (short)auVar62._6_2_) * auVar62._6_2_ |
                       ((short)auVar67._6_2_ >= (short)auVar62._6_2_) * auVar67._6_2_;
              uVar54 = ((short)auVar67._8_2_ < (short)auVar62._8_2_) * auVar62._8_2_ |
                       ((short)auVar67._8_2_ >= (short)auVar62._8_2_) * auVar67._8_2_;
              uVar55 = ((short)auVar67._10_2_ < (short)auVar62._10_2_) * auVar62._10_2_ |
                       ((short)auVar67._10_2_ >= (short)auVar62._10_2_) * auVar67._10_2_;
              uVar56 = ((short)auVar67._12_2_ < (short)auVar62._12_2_) * auVar62._12_2_ |
                       ((short)auVar67._12_2_ >= (short)auVar62._12_2_) * auVar67._12_2_;
              uVar57 = ((short)auVar67._14_2_ < (short)auVar62._14_2_) * auVar62._14_2_ |
                       ((short)auVar67._14_2_ >= (short)auVar62._14_2_) * auVar67._14_2_;
              sVar1 = (-1 < (short)uVar48) * uVar48;
              sVar2 = (-1 < (short)uVar51) * uVar51;
              sVar3 = (-1 < (short)uVar52) * uVar52;
              sVar4 = (-1 < (short)uVar53) * uVar53;
              sVar5 = (-1 < (short)uVar54) * uVar54;
              sVar63 = (-1 < (short)uVar55) * uVar55;
              sVar29 = (-1 < (short)uVar56) * uVar56;
              sVar59 = (-1 < (short)uVar57) * uVar57;
              sVar34 = auVar37._0_2_;
              auVar49._0_2_ = (ushort)(sVar1 < sVar34) * sVar34 | (ushort)(sVar1 >= sVar34) * sVar1;
              sVar1 = auVar37._2_2_;
              auVar49._2_2_ = (ushort)(sVar2 < sVar1) * sVar1 | (ushort)(sVar2 >= sVar1) * sVar2;
              sVar2 = auVar37._4_2_;
              auVar49._4_2_ = (ushort)(sVar3 < sVar2) * sVar2 | (ushort)(sVar3 >= sVar2) * sVar3;
              sVar3 = auVar37._6_2_;
              auVar49._6_2_ = (ushort)(sVar4 < sVar3) * sVar3 | (ushort)(sVar4 >= sVar3) * sVar4;
              sVar4 = auVar37._8_2_;
              auVar49._8_2_ = (ushort)(sVar5 < sVar4) * sVar4 | (ushort)(sVar5 >= sVar4) * sVar5;
              sVar5 = auVar37._10_2_;
              auVar49._10_2_ = (ushort)(sVar63 < sVar5) * sVar5 | (ushort)(sVar63 >= sVar5) * sVar63
              ;
              sVar63 = auVar37._12_2_;
              auVar49._12_2_ =
                   (ushort)(sVar29 < sVar63) * sVar63 | (ushort)(sVar29 >= sVar63) * sVar29;
              sVar29 = auVar37._14_2_;
              auVar49._14_2_ =
                   (ushort)(sVar59 < sVar29) * sVar29 | (ushort)(sVar59 >= sVar29) * sVar59;
              sVar34 = in_XMM12._0_2_;
              auVar61._0_2_ = -(ushort)(sVar34 == -1);
              sVar39 = in_XMM12._2_2_;
              auVar61._2_2_ = -(ushort)(sVar39 == -1);
              sVar40 = in_XMM12._4_2_;
              auVar61._4_2_ = -(ushort)(sVar40 == -1);
              sVar41 = in_XMM12._6_2_;
              auVar61._6_2_ = -(ushort)(sVar41 == -1);
              sVar42 = in_XMM12._8_2_;
              auVar61._8_2_ = -(ushort)(sVar42 == -1);
              sVar43 = in_XMM12._10_2_;
              auVar61._10_2_ = -(ushort)(sVar43 == -1);
              sVar44 = in_XMM12._12_2_;
              sVar45 = in_XMM12._14_2_;
              auVar61._12_2_ = -(ushort)(sVar44 == -1);
              auVar61._14_2_ = -(ushort)(sVar45 == -1);
              auVar66 = ~auVar61 & auVar49;
              auVar68._4_2_ = local_108;
              auVar68._0_4_ = uVar35;
              auVar68._6_2_ = sStack_106;
              auVar68._8_2_ = local_108;
              auVar68._10_2_ = sStack_106;
              auVar68._12_2_ = local_108;
              auVar68._14_2_ = sStack_106;
              auVar46 = pblendvb(auVar62,auVar68,auVar61);
              auVar68 = pblendvb(auVar67,auVar68,auVar61);
              sVar29 = auVar66._0_2_;
              sVar59 = auVar66._2_2_;
              sVar1 = auVar66._14_2_;
              sVar63 = auVar66._4_2_;
              sVar5 = auVar66._6_2_;
              sVar4 = auVar66._8_2_;
              sVar3 = auVar66._10_2_;
              sVar2 = auVar66._12_2_;
              if (7 < uVar20) {
                bVar7 = sVar29 < (short)local_138;
                uVar48 = (ushort)!bVar7 * (short)local_138;
                bVar8 = sVar59 < local_138._2_2_;
                uVar51 = (ushort)!bVar8 * local_138._2_2_;
                bVar9 = sVar63 < local_138._4_2_;
                uVar52 = (ushort)!bVar9 * local_138._4_2_;
                bVar10 = sVar4 < (short)uStack_130;
                uVar53 = (ushort)!bVar10 * (short)uStack_130;
                bVar11 = sVar3 < uStack_130._2_2_;
                uVar54 = (ushort)!bVar11 * uStack_130._2_2_;
                bVar12 = sVar2 < uStack_130._4_2_;
                uVar55 = (ushort)!bVar12 * uStack_130._4_2_;
                local_138 = CONCAT26((ushort)(sVar5 < local_138._6_2_) * sVar5 |
                                     (ushort)(sVar5 >= local_138._6_2_) * local_138._6_2_,
                                     CONCAT24((ushort)bVar9 * sVar63 | uVar52,
                                              CONCAT22((ushort)bVar8 * sVar59 | uVar51,
                                                       (ushort)bVar7 * sVar29 | uVar48)));
                uStack_130 = CONCAT26((ushort)(sVar1 < uStack_130._6_2_) * sVar1 |
                                      (ushort)(sVar1 >= uStack_130._6_2_) * uStack_130._6_2_,
                                      CONCAT24((ushort)bVar12 * sVar2 | uVar55,
                                               CONCAT22((ushort)bVar11 * sVar3 | uVar54,
                                                        (ushort)bVar10 * sVar4 | uVar53)));
                local_148._2_2_ =
                     (ushort)((short)local_148._2_2_ < sVar59) * sVar59 |
                     (ushort)((short)local_148._2_2_ >= sVar59) * local_148._2_2_;
                local_148._0_2_ =
                     (ushort)((short)local_148._0_2_ < sVar29) * sVar29 |
                     (ushort)((short)local_148._0_2_ >= sVar29) * local_148._0_2_;
                local_148._4_2_ =
                     (ushort)((short)local_148._4_2_ < sVar63) * sVar63 |
                     (ushort)((short)local_148._4_2_ >= sVar63) * local_148._4_2_;
                local_148._6_2_ =
                     (ushort)((short)local_148._6_2_ < sVar5) * sVar5 |
                     (ushort)((short)local_148._6_2_ >= sVar5) * local_148._6_2_;
                local_148._8_2_ =
                     (ushort)((short)local_148._8_2_ < sVar4) * sVar4 |
                     (ushort)((short)local_148._8_2_ >= sVar4) * local_148._8_2_;
                local_148._10_2_ =
                     (ushort)((short)local_148._10_2_ < sVar3) * sVar3 |
                     (ushort)((short)local_148._10_2_ >= sVar3) * local_148._10_2_;
                local_148._12_2_ =
                     (ushort)((short)local_148._12_2_ < sVar2) * sVar2 |
                     (ushort)((short)local_148._12_2_ >= sVar2) * local_148._12_2_;
                local_148._14_2_ =
                     (ushort)((short)local_148._14_2_ < sVar1) * sVar1 |
                     (ushort)((short)local_148._14_2_ >= sVar1) * local_148._14_2_;
              }
              ptr_00[uVar20] = sVar29;
              ptr_01[uVar20] = auVar46._0_2_;
              auVar38._0_2_ = -(ushort)(sVar34 < (short)local_a8);
              auVar38._2_2_ = -(ushort)(sVar39 < local_a8._2_2_);
              auVar38._4_2_ = -(ushort)(sVar40 < (short)uStack_a4);
              auVar38._6_2_ = -(ushort)(sVar41 < uStack_a4._2_2_);
              auVar38._8_2_ = -(ushort)(sVar42 < (short)uStack_a0);
              auVar38._10_2_ = -(ushort)(sVar43 < uStack_a0._2_2_);
              auVar38._12_2_ = -(ushort)(sVar44 < (short)uStack_9c);
              auVar38._14_2_ = -(ushort)(sVar45 < uStack_9c._2_2_);
              auVar70 = psraw(in_XMM12,0xf);
              auVar71 = ~auVar70 & auVar38 & auVar69;
              auVar64._0_2_ = -(ushort)(sVar29 == local_78._0_2_);
              auVar64._2_2_ = -(ushort)(sVar59 == local_78._2_2_);
              auVar64._4_2_ = -(ushort)(sVar63 == local_78._4_2_);
              auVar64._6_2_ = -(ushort)(sVar5 == local_78._6_2_);
              auVar64._8_2_ = -(ushort)(sVar4 == local_78._8_2_);
              auVar64._10_2_ = -(ushort)(sVar3 == local_78._10_2_);
              auVar64._12_2_ = -(ushort)(sVar2 == local_78._12_2_);
              auVar64._14_2_ = -(ushort)(sVar1 == local_78._14_2_);
              auVar58._0_2_ = -(ushort)(local_78._0_2_ < sVar29);
              auVar58._2_2_ = -(ushort)(local_78._2_2_ < sVar59);
              auVar58._4_2_ = -(ushort)(local_78._4_2_ < sVar63);
              auVar58._6_2_ = -(ushort)(local_78._6_2_ < sVar5);
              auVar58._8_2_ = -(ushort)(local_78._8_2_ < sVar4);
              auVar58._10_2_ = -(ushort)(local_78._10_2_ < sVar3);
              auVar58._12_2_ = -(ushort)(local_78._12_2_ < sVar2);
              auVar58._14_2_ = -(ushort)(local_78._14_2_ < sVar1);
              local_78 = pblendvb(local_78,auVar49,auVar58 & auVar71);
              auVar50._0_2_ = -(ushort)(sVar34 < local_d8._0_2_);
              auVar50._2_2_ = -(ushort)(sVar39 < local_d8._2_2_);
              auVar50._4_2_ = -(ushort)(sVar40 < local_d8._4_2_);
              auVar50._6_2_ = -(ushort)(sVar41 < local_d8._6_2_);
              auVar50._8_2_ = -(ushort)(sVar42 < local_d8._8_2_);
              auVar50._10_2_ = -(ushort)(sVar43 < local_d8._10_2_);
              auVar50._12_2_ = -(ushort)(sVar44 < local_d8._12_2_);
              auVar50._14_2_ = -(ushort)(sVar45 < local_d8._14_2_);
              auVar70 = pblendvb(auVar58 & auVar71,auVar71,auVar50 & auVar64);
              local_c8 = pblendvb(local_c8,auVar36,auVar70);
              local_d8 = pblendvb(local_d8,in_XMM12,(auVar50 & auVar64 | auVar58) & auVar71);
              in_XMM12 = paddsw(in_XMM12,_DAT_00904d10);
              uVar20 = uVar20 + 1;
            } while (uVar22 != uVar20);
            auVar36 = paddsw(auVar36,_DAT_00904d20);
            uVar25 = uVar25 + 8;
          } while (uVar25 < uVar19);
        }
        lVar18 = 0;
        iVar16 = 0;
        iVar17 = 0;
        iVar21 = 0;
        do {
          uVar48 = *(ushort *)(local_78 + lVar18 * 2);
          if ((short)(ushort)uVar23 < (short)uVar48) {
            uVar23 = (uint)uVar48;
            iVar17 = (int)*(short *)(local_c8 + lVar18 * 2);
            iVar21 = (int)*(short *)(local_d8 + lVar18 * 2);
            iVar16 = (int)*(short *)(local_c8 + lVar18 * 2);
          }
          else if (uVar48 == (ushort)uVar23) {
            iVar27 = (int)*(short *)(local_d8 + lVar18 * 2);
            if (iVar27 < iVar21) {
              iVar17 = (int)*(short *)(local_c8 + lVar18 * 2);
              iVar21 = iVar27;
              iVar16 = (int)*(short *)(local_c8 + lVar18 * 2);
            }
            else if ((iVar21 == iVar27) &&
                    (iVar27 = (int)*(short *)(local_c8 + lVar18 * 2), bVar7 = iVar27 <= iVar17,
                    iVar17 = iVar16, bVar7)) {
              iVar17 = iVar27;
              iVar16 = iVar27;
            }
          }
          sVar29 = (short)uVar23;
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 != 8);
        auVar66._0_2_ = -(ushort)((short)local_138 < local_108);
        auVar66._2_2_ = -(ushort)(local_138._2_2_ < sStack_106);
        auVar66._4_2_ = -(ushort)(local_138._4_2_ < local_108);
        auVar66._6_2_ = -(ushort)(local_138._6_2_ < sStack_106);
        auVar66._8_2_ = -(ushort)((short)uStack_130 < local_108);
        auVar66._10_2_ = -(ushort)(uStack_130._2_2_ < sStack_106);
        auVar66._12_2_ = -(ushort)(uStack_130._4_2_ < local_108);
        auVar66._14_2_ = -(ushort)(uStack_130._6_2_ < sStack_106);
        auVar47._0_2_ = -(ushort)(local_b8 < local_148._0_2_);
        auVar47._2_2_ = -(ushort)(sStack_b6 < local_148._2_2_);
        auVar47._4_2_ = -(ushort)(sStack_b4 < local_148._4_2_);
        auVar47._6_2_ = -(ushort)(sStack_b2 < local_148._6_2_);
        auVar47._8_2_ = -(ushort)(sStack_b0 < local_148._8_2_);
        auVar47._10_2_ = -(ushort)(sStack_ae < local_148._10_2_);
        auVar47._12_2_ = -(ushort)(sStack_ac < local_148._12_2_);
        auVar47._14_2_ = -(ushort)(sStack_aa < local_148._14_2_);
        auVar47 = auVar47 | auVar66;
        if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar47[0xf] < '\0') {
          *(byte *)&local_68->flag = (byte)local_68->flag | 0x40;
          sVar29 = 0;
          iVar21 = 0;
          iVar17 = 0;
        }
        local_68->score = (int)sVar29;
        local_68->end_query = iVar17;
        local_68->end_ref = iVar21;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar13;
        }
        return ppVar13;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}